

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O3

void __thiscall
draco::MeshAttributeCornerTable::AddSeamEdge(MeshAttributeCornerTable *this,CornerIndex c)

{
  ulong *puVar1;
  long lVar2;
  CornerTable *pCVar3;
  _Bit_type *p_Var4;
  uint uVar5;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar6;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar7;
  uint uVar8;
  
  IVar6.value_ = 0xffffffff;
  lVar2 = (long)(this->is_edge_on_seam_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar1 = (ulong *)(lVar2 + (ulong)(c.value_ >> 6) * 8);
  *puVar1 = *puVar1 | 1L << ((byte)c.value_ & 0x3f);
  pCVar3 = this->corner_table_;
  IVar7.value_ = 0xffffffff;
  if (c.value_ != 0xffffffff) {
    uVar8 = c.value_ - 2;
    if (0x55555555 < (c.value_ + 1) * -0x55555555) {
      uVar8 = c.value_ + 1;
    }
    IVar7.value_ = 0xffffffff;
    if (uVar8 != 0xffffffff) {
      IVar7.value_ = (pCVar3->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
    }
  }
  p_Var4 = (this->is_vertex_on_seam_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  p_Var4[IVar7.value_ >> 6] = p_Var4[IVar7.value_ >> 6] | 1L << ((byte)IVar7.value_ & 0x3f);
  if (c.value_ == 0xffffffff) {
    *(byte *)((long)p_Var4 + 0x1fffffff) = *(byte *)((long)p_Var4 + 0x1fffffff) | 0x80;
    return;
  }
  if (c.value_ * -0x55555555 < 0x55555556) {
    uVar8 = c.value_ + 2;
    IVar7.value_ = 0xffffffff;
    if (uVar8 != 0xffffffff) goto LAB_00148a64;
  }
  else {
    uVar8 = c.value_ - 1;
LAB_00148a64:
    IVar7.value_ = (pCVar3->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
  }
  p_Var4[IVar7.value_ >> 6] = p_Var4[IVar7.value_ >> 6] | 1L << ((byte)IVar7.value_ & 0x3f);
  uVar8 = (pCVar3->opposite_corners_).vector_.
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[c.value_].value_;
  if (uVar8 == 0xffffffff) {
    return;
  }
  this->no_interior_seams_ = false;
  puVar1 = (ulong *)(lVar2 + (ulong)(uVar8 >> 6) * 8);
  *puVar1 = *puVar1 | 1L << ((byte)uVar8 & 0x3f);
  uVar5 = uVar8 - 2;
  if (0x55555555 < (uVar8 + 1) * -0x55555555) {
    uVar5 = uVar8 + 1;
  }
  IVar7.value_ = 0xffffffff;
  if (uVar5 != 0xffffffff) {
    IVar7.value_ = (pCVar3->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar5].value_;
  }
  p_Var4[IVar7.value_ >> 6] = p_Var4[IVar7.value_ >> 6] | 1L << ((byte)IVar7.value_ & 0x3f);
  if (uVar8 * -0x55555555 < 0x55555556) {
    uVar8 = uVar8 + 2;
    if (uVar8 == 0xffffffff) goto LAB_00148b01;
  }
  else {
    uVar8 = uVar8 - 1;
  }
  IVar6.value_ = (pCVar3->corner_to_vertex_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
LAB_00148b01:
  p_Var4[IVar6.value_ >> 6] = p_Var4[IVar6.value_ >> 6] | 1L << ((byte)IVar6.value_ & 0x3f);
  return;
}

Assistant:

void MeshAttributeCornerTable::AddSeamEdge(CornerIndex c) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  is_edge_on_seam_[c.value()] = true;
  // Mark seam vertices.
  is_vertex_on_seam_[corner_table_->Vertex(corner_table_->Next(c)).value()] =
      true;
  is_vertex_on_seam_[corner_table_->Vertex(corner_table_->Previous(c))
                         .value()] = true;

  const CornerIndex opp_corner = corner_table_->Opposite(c);
  if (opp_corner != kInvalidCornerIndex) {
    no_interior_seams_ = false;
    is_edge_on_seam_[opp_corner.value()] = true;
    is_vertex_on_seam_[corner_table_->Vertex(corner_table_->Next(opp_corner))
                           .value()] = true;
    is_vertex_on_seam_
        [corner_table_->Vertex(corner_table_->Previous(opp_corner)).value()] =
            true;
  }
}